

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O2

void __thiscall
xray_re::xr_ogf_v4::partition_io::import(partition_io *this,xr_reader *r,xr_bone_vec *all_bones)

{
  uint uVar1;
  ushort *puVar2;
  uint *puVar3;
  __type _Var4;
  pointer ppxVar5;
  reference ppxVar6;
  xr_bone *this_00;
  ulong __n;
  ulong uVar7;
  bool bVar8;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  xr_reader::r_sz(r,&(this->super_xr_partition).m_name);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  puVar2 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  uVar7 = (ulong)*puVar2;
  while( true ) {
    bVar8 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar8) {
      std::__cxx11::string::~string((string *)&local_50);
      return;
    }
    xr_reader::r_sz(r,&local_50);
    puVar3 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
    uVar1 = *puVar3;
    __n = (ulong)uVar1;
    if (0x3f < __n) break;
    ppxVar5 = (all_bones->
              super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(all_bones->
                      super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppxVar5 >> 3) <= __n) {
      std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::resize
                (all_bones,__n + 1);
      ppxVar5 = (all_bones->
                super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>)._M_impl
                .super__Vector_impl_data._M_start;
    }
    if (ppxVar5[__n] == (xr_bone *)0x0) {
      this_00 = (xr_bone *)operator_new(0x340);
      bone_io::bone_io((bone_io *)this_00);
      this_00->m_id = (uint16_t)uVar1;
      std::__cxx11::string::_M_assign((string *)&this_00->m_name);
      (all_bones->super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>).
      _M_impl.super__Vector_impl_data._M_start[__n] = this_00;
    }
    else {
      ppxVar6 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::at
                          (all_bones,__n);
      _Var4 = std::operator==(&(*ppxVar6)->m_name,&local_50);
      if (!_Var4) {
        __assert_fail("all_bones.at(id)->name() == name",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                      ,0x180,
                      "void xray_re::xr_ogf_v4::partition_io::import(xr_reader &, xr_bone_vec &)");
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->super_xr_partition).m_bones,&local_50);
  }
  __assert_fail("id < MAX_BONES",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                ,0x178,"void xray_re::xr_ogf_v4::partition_io::import(xr_reader &, xr_bone_vec &)");
}

Assistant:

inline void xr_ogf_v4::partition_io::import(xr_reader& r, xr_bone_vec& all_bones)
{
	r.r_sz(m_name);
	std::string name;
	for (uint_fast32_t n = r.r_u16(); n; --n) {
		r.r_sz(name);
		uint_fast32_t id = r.r_u32();
		xr_assert(id < MAX_BONES);
		if (all_bones.size() <= id)
			all_bones.resize(id + 1);
		if (all_bones[id] == 0) {
			xr_ogf_v4::bone_io* bone = new xr_ogf_v4::bone_io;
			bone->define(uint16_t(id), name);
			all_bones[id] = bone;
		} else {
			xr_assert(all_bones.at(id)->name() == name);
		}
		m_bones.push_back(name);
	}
}